

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::SFML::Shutdown(Window *window)

{
  bool bVar1;
  WindowHandle WVar2;
  WindowHandle WVar3;
  pointer this;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  local_60;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  local_58;
  iterator it;
  const_iterator local_48;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  local_40;
  Window *local_38;
  unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  *local_30;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  local_20;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  found;
  bool needReplacement;
  Window *window_local;
  
  WVar2 = sf::Window::getSystemHandle((anonymous_namespace)::s_currWindowCtx->window);
  WVar3 = sf::Window::getSystemHandle(window);
  found._M_current._7_1_ = WVar2 == WVar3;
  local_28._M_current =
       (unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
        *)std::
          vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
          ::begin((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                   *)(anonymous_namespace)::s_windowContexts);
  local_30 = (unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
              *)std::
                vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                ::end((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                       *)(anonymous_namespace)::s_windowContexts);
  local_38 = window;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>*,std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>,std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>>>>,ImGui::SFML::Shutdown(sf::Window_const&)::__0>
                       (local_28,(__normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
                                  )local_30,(anon_class_8_1_722fcd2e_for__M_pred)window);
  local_40._M_current =
       (unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
        *)std::
          vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
          ::end((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                 *)(anonymous_namespace)::s_windowContexts);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>const*,std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>,std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>>>>
    ::
    __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>*>
              ((__normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>const*,std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>,std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>>>>
                *)&local_48,&local_20);
    it = std::
         vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
         ::erase((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                  *)(anonymous_namespace)::s_windowContexts,local_48);
    if ((found._M_current._7_1_ & 1) != 0) {
      local_58._M_current =
           (unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
            *)std::
              vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
              ::begin((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                       *)(anonymous_namespace)::s_windowContexts);
      local_60._M_current =
           (unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
            *)std::
              vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
              ::end((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                     *)(anonymous_namespace)::s_windowContexts);
      bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
      if (bVar1) {
        this = __gnu_cxx::
               __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
               ::operator->(&local_58);
        (anonymous_namespace)::s_currWindowCtx =
             std::
             unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
             ::get(this);
        SetCurrentContext((anonymous_namespace)::s_currWindowCtx->imContext);
      }
      else {
        (anonymous_namespace)::s_currWindowCtx = (pointer)0x0;
        SetCurrentContext((ImGuiContext *)0x0);
      }
    }
    return;
  }
  __assert_fail("found != s_windowContexts.end() && \"Window wasn\'t inited properly: forgot to call ImGui::SFML::Init(window)?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x21b,"void ImGui::SFML::Shutdown(const sf::Window &)");
}

Assistant:

void Shutdown(const sf::Window& window) {
    bool needReplacement = (s_currWindowCtx->window->getSystemHandle() == window.getSystemHandle());

    // remove window's context
    auto found = std::find_if(s_windowContexts.begin(), s_windowContexts.end(),
                              [&](std::unique_ptr<WindowContext>& ctx) {
                                  return ctx->window->getSystemHandle() == window.getSystemHandle();
                              });
    assert(found != s_windowContexts.end() &&
           "Window wasn't inited properly: forgot to call ImGui::SFML::Init(window)?");
    s_windowContexts.erase(found); // s_currWindowCtx can become invalid here!

    // set current context to some window for convenience if needed
    if (needReplacement) {
        auto it = s_windowContexts.begin();
        if (it != s_windowContexts.end()) {
            // set to some other window
            s_currWindowCtx = it->get();
            ImGui::SetCurrentContext(s_currWindowCtx->imContext);
        } else {
            // no alternatives...
            s_currWindowCtx = nullptr;
            ImGui::SetCurrentContext(nullptr);
        }
    }
}